

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

int checkBooleanOption(char *option)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  ppcVar1 = booleanOptionTags;
  lVar5 = -1;
  iVar3 = 1;
  while (lVar5 != 5) {
    iVar2 = strcmp(ppcVar1[lVar5 + 1],option + 1);
    lVar5 = lVar5 + 1;
    if (iVar2 == 0) goto LAB_0010170d;
  }
  sVar4 = strlen(option);
  if (sVar4 < 4) {
    return 0;
  }
  if (option[1] != 'n') {
    return 0;
  }
  if (option[2] != 'o') {
    return 0;
  }
  lVar5 = -1;
  do {
    if (lVar5 == 5) {
      return 0;
    }
    iVar3 = strcmp(ppcVar1[lVar5 + 1],option + 3);
    lVar5 = lVar5 + 1;
  } while (iVar3 != 0);
  iVar3 = 0;
LAB_0010170d:
  booleanOptions[lVar5] = iVar3;
  return 1;
}

Assistant:

int checkBooleanOption (char *option)
{
    int o;

    for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
    {
        if (strcmp (booleanOptionTags[o], &option[1]) == 0)
        {
            booleanOptions[o] = 1;
            return 1;
        }
    }

    if (strlen (option) > 3 && option[1] == 'n' && option[2] == 'o')
        for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
        {
            if (strcmp (booleanOptionTags[o], &option[3]) == 0)
            {
                booleanOptions[o] = 0;
                return 1;
            }
        }
    return 0;
}